

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O3

IvVec2 * deqp::egl::ivVec2(IVec2 *vec)

{
  int iVar1;
  int iVar2;
  IvVec2 *in_RDI;
  
  iVar1 = vec->m_data[1];
  iVar2 = vec->m_data[0];
  in_RDI->m_data[0].m_hasNaN = false;
  in_RDI->m_data[0].m_lo = INFINITY;
  in_RDI->m_data[0].m_hi = -INFINITY;
  in_RDI->m_data[1].m_hasNaN = false;
  in_RDI->m_data[1].m_lo = INFINITY;
  in_RDI->m_data[1].m_hi = -INFINITY;
  in_RDI->m_data[0].m_lo = (double)iVar2;
  in_RDI->m_data[0].m_hi = (double)iVar2;
  in_RDI->m_data[1].m_lo = (double)iVar1;
  in_RDI->m_data[1].m_hi = (double)iVar1;
  return in_RDI;
}

Assistant:

IvVec2 ivVec2 (const IVec2& vec)
{
	return IvVec2(double(vec.x()), double(vec.y()));
}